

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int memory_seek(mtar_t *tar,size_t offset)

{
  size_t offset_local;
  mtar_t *tar_local;
  
  if (tar->stream == (void *)0x0) {
    tar_local._4_4_ = -5;
  }
  else if (tar->memory_size < offset) {
    tar_local._4_4_ = -5;
  }
  else {
    tar->memory_pos = offset;
    tar_local._4_4_ = 0;
  }
  return tar_local._4_4_;
}

Assistant:

static int memory_seek(mtar_t *tar, size_t offset) {
  if (!tar->stream)
    return MTAR_ESEEKFAIL;

  if (offset > tar->memory_size)
    return MTAR_ESEEKFAIL;

  tar->memory_pos = offset;
  return MTAR_ESUCCESS;
}